

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_208::GlobalRefining::~GlobalRefining(GlobalRefining *this)

{
  Pass::~Pass(&this->super_Pass);
  operator_delete(this,0x30);
  return;
}

Assistant:

bool requiresNonNullableLocalFixups() override { return false; }